

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O3

void __thiscall
leveldb::MemTableConstructor::MemTableConstructor(MemTableConstructor *this,Comparator *cmp)

{
  _Rb_tree_header *p_Var1;
  MemTable *this_00;
  
  (this->super_Constructor).data_._M_t._M_impl.
  super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>._M_key_compare.cmp = cmp;
  p_Var1 = &(this->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header;
  (this->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_Constructor)._vptr_Constructor = (_func_int **)&PTR__MemTableConstructor_0017d1b8;
  (this->internal_comparator_).super_Comparator._vptr_Comparator =
       (_func_int **)&PTR__Comparator_0017d760;
  (this->internal_comparator_).user_comparator_ = cmp;
  this_00 = (MemTable *)operator_new(0x70);
  MemTable::MemTable(this_00,&this->internal_comparator_);
  this->memtable_ = this_00;
  this_00->refs_ = this_00->refs_ + 1;
  return;
}

Assistant:

explicit MemTableConstructor(const Comparator* cmp)
      : Constructor(cmp), internal_comparator_(cmp) {
    memtable_ = new MemTable(internal_comparator_);
    memtable_->Ref();
  }